

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void raviV_op_closure(lua_State *L,CallInfo *ci,LClosure *cl,int a,int Bx)

{
  int iVar1;
  StkId base;
  Proto *p;
  int *piVar2;
  LClosure *pLVar3;
  int iVar4;
  char *__assertion;
  StkId ra;
  
  base = (ci->u).l.base;
  p = cl->p->p[Bx];
  pLVar3 = getcached(p,cl->upvals,base);
  ra = base + a;
  if (pLVar3 != (LClosure *)0x0) {
    if ((pLVar3->tt & 0xe) < 10) {
      (ra->value_).gc = (GCObject *)pLVar3;
      ra->tt_ = 0x8006;
      if ((pLVar3->tt == '\x06') &&
         ((L == (lua_State *)0x0 || ((pLVar3->marked & (L->l_G->currentwhite ^ 0x18)) == 0))))
      goto LAB_0013032f;
      __assertion = "0";
    }
    else {
      __assertion = "(((x_)->tt) & 0x0F) < (9+1)";
    }
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                  ,0xb7f,"void raviV_op_closure(lua_State *, CallInfo *, LClosure *, int, int)");
  }
  pushclosure(L,p,cl->upvals,base,ra);
LAB_0013032f:
  if (0 < L->l_G->GCdebt) {
    L->top = ra + 1;
    luaC_step(L);
    L->top = ci->top;
  }
  piVar2 = *(int **)&L[-1].hookmask;
  iVar1 = *piVar2;
  iVar4 = iVar1 + -1;
  *piVar2 = iVar4;
  if (iVar4 == 0) {
    *piVar2 = iVar1;
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                ,0xb81,"void raviV_op_closure(lua_State *, CallInfo *, LClosure *, int, int)");
}

Assistant:

void raviV_op_closure(lua_State *L, CallInfo *ci, LClosure *cl, int a, int Bx) {
  StkId base = ci->u.l.base;
  Proto *p = cl->p->p[Bx];
  LClosure *ncl = getcached(p, cl->upvals, base); /* cached closure */
  StkId ra = base + a;
  if (ncl == NULL) /* no match? */ {
    pushclosure(L, p, cl->upvals, base, ra); /* create a new one */
  }
  else {
    setclLvalue(L, ra, ncl); /* push cashed closure */
  }
  checkGC_protectbase(L, ra + 1);
}